

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_invalidate_phys_page_range_x86_64
               (uc_struct_conflict *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  PageDesc *p;
  page_collection *pages;
  
  p = page_find_alloc(uc,start >> 0xc,0);
  if (p != (PageDesc *)0x0) {
    pages = page_collection_lock_x86_64(uc,start,end);
    tb_invalidate_phys_page_range__locked(uc,pages,p,start,end,0);
    g_tree_destroy(pages->tree);
    g_free(pages);
    return;
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_range(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *pages;
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (p == NULL) {
        return;
    }
    pages = page_collection_lock(uc, start, end);
    tb_invalidate_phys_page_range__locked(uc, pages, p, start, end, 0);
    page_collection_unlock(pages);
}